

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_id_func.h
# Opt level: O1

void __thiscall TinyIntIDFunc<1>::TinyIntIDFunc(TinyIntIDFunc<1> *this,int preimage)

{
  uint uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  
  this->preimage_ = preimage;
  uVar1 = preimage + 0x3fU;
  if ((int)(preimage + 0x3fU) < 0) {
    uVar1 = preimage + 0x7eU;
  }
  (this->data_).preimage_count_ = (int)uVar1 >> 6;
  if (preimage + 0x7eU < 0x7f) {
    puVar2 = (unsigned_long *)0x0;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-0x7f < preimage) {
      uVar3 = (long)((int)uVar1 >> 6) << 3;
    }
    puVar2 = (unsigned_long *)operator_new__(uVar3);
  }
  (this->data_).data_ = puVar2;
  return;
}

Assistant:

explicit TinyIntIDFunc(int preimage)
        : preimage_(preimage)
        , data_((preimage + entry_count_per_uint64 - 1) / entry_count_per_uint64)
    {
    }